

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::PragmaInstr::Record(PragmaInstr *this,uint32 nativeBufferOffset)

{
  code *pcVar1;
  bool bVar2;
  Func *pFVar3;
  undefined4 *puVar4;
  EntryPointInfo *this_00;
  uint32 nativeBufferOffset_local;
  PragmaInstr *this_local;
  
  pFVar3 = Func::GetTopFunc((this->super_Instr).m_func);
  bVar2 = Func::DoRecordNativeMap(pFVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x824,"(this->m_func->GetTopFunc()->DoRecordNativeMap())",
                       "this->m_func->GetTopFunc()->DoRecordNativeMap()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = Func::IsOOPJIT((this->super_Instr).m_func);
  if (!bVar2) {
    pFVar3 = Func::GetTopFunc((this->super_Instr).m_func);
    this_00 = Func::GetInProcJITEntryPointInfo(pFVar3);
    Js::EntryPointInfo::RecordNativeMap(this_00,nativeBufferOffset,this->m_statementIndex);
  }
  return;
}

Assistant:

void
PragmaInstr::Record(uint32 nativeBufferOffset)
{
    // Currently the only pragma instructions are for Source Info
    Assert(this->m_func->GetTopFunc()->DoRecordNativeMap());
    if (!m_func->IsOOPJIT())
    {
        m_func->GetTopFunc()->GetInProcJITEntryPointInfo()->RecordNativeMap(nativeBufferOffset, m_statementIndex);
    }
}